

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

FindInfo __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
::find_first_non_full
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
           *this,size_t hashval)

{
  FindInfo FVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  long *in_RDI;
  BitMask<unsigned_int,_16,_0> mask;
  Group g;
  probe_seq<16UL> seq;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  size_t in_stack_ffffffffffffff98;
  probe_seq<16UL> *this_00;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
  *in_stack_ffffffffffffffa0;
  long lVar5;
  uint local_4c;
  GroupSse2Impl local_48;
  probe_seq<16UL> local_38;
  size_t local_10;
  
  probe(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  while( true ) {
    lVar5 = *in_RDI;
    sVar4 = probe_seq<16UL>::offset(&local_38);
    GroupSse2Impl::GroupSse2Impl(&local_48,(ctrl_t *)(lVar5 + sVar4));
    local_4c = (uint)GroupSse2Impl::MatchEmptyOrDeleted
                               ((GroupSse2Impl *)
                                CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar2 = BitMask::operator_cast_to_bool((BitMask *)&local_4c);
    if (bVar2) {
      uVar3 = BitMask<unsigned_int,_16,_0>::LowestBitSet((BitMask<unsigned_int,_16,_0> *)0x22f6b8);
      this_00 = &local_38;
      local_10 = probe_seq<16UL>::offset(this_00,(ulong)uVar3);
      sVar4 = probe_seq<16UL>::getindex(this_00);
      FVar1.probe_length = sVar4;
      FVar1.offset = local_10;
      return FVar1;
    }
    sVar4 = probe_seq<16UL>::getindex(&local_38);
    in_stack_ffffffffffffff97 = sVar4 < (ulong)in_RDI[3];
    if (!(bool)in_stack_ffffffffffffff97) break;
    probe_seq<16UL>::next(&local_38);
  }
  __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x974,
                "FindInfo phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::find_first_non_full(size_t) [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
               );
}

Assistant:

FindInfo find_first_non_full(size_t hashval)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					auto mask = g.MatchEmptyOrDeleted();
					if (mask) {
						return {seq.offset((size_t)mask.LowestBitSet()), seq.getindex()};
					}
					assert(seq.getindex() < capacity_ && "full table!");
					seq.next();
				}
			}